

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test5::getSwizzleTypeProperties
          (GPUShaderFP64Test5 *this,_swizzle_type type,string *out_swizzle_string,
          uint *out_n_components,uint *out_component_order)

{
  TestError *this_00;
  string local_70 [8];
  string result_swizzle_string;
  undefined8 uStack_48;
  uint result_n_components;
  uint result_component_order [4];
  uint *out_component_order_local;
  uint *out_n_components_local;
  string *out_swizzle_string_local;
  _swizzle_type type_local;
  GPUShaderFP64Test5 *this_local;
  
  uStack_48 = 0;
  result_component_order[0] = 0;
  result_component_order[1] = 0;
  result_swizzle_string.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_70);
  switch(type) {
  case SWIZZLE_TYPE_NONE:
    std::__cxx11::string::operator=(local_70,"");
    result_swizzle_string.field_2._12_4_ = 0;
    break;
  case SWIZZLE_TYPE_XWZY:
    std::__cxx11::string::operator=(local_70,"xwzy");
    result_swizzle_string.field_2._12_4_ = 4;
    uStack_48 = 0x300000000;
    result_component_order[0] = 2;
    result_component_order[1] = 1;
    break;
  case SWIZZLE_TYPE_XZXY:
    std::__cxx11::string::operator=(local_70,"xzxy");
    result_swizzle_string.field_2._12_4_ = 4;
    uStack_48 = 0x200000000;
    result_component_order[0] = 0;
    result_component_order[1] = 1;
    break;
  case SWIZZLE_TYPE_XZY:
    std::__cxx11::string::operator=(local_70,"xzy");
    result_swizzle_string.field_2._12_4_ = 3;
    uStack_48 = 0x200000000;
    result_component_order[0] = 1;
    break;
  case SWIZZLE_TYPE_XZYW:
    std::__cxx11::string::operator=(local_70,"xzyw");
    result_swizzle_string.field_2._12_4_ = 4;
    uStack_48 = 0x200000000;
    result_component_order[0] = 1;
    result_component_order[1] = 3;
    break;
  case SWIZZLE_TYPE_Y:
    std::__cxx11::string::operator=(local_70,"y");
    result_swizzle_string.field_2._12_4_ = 1;
    uStack_48 = CONCAT44(result_n_components,1);
    break;
  case SWIZZLE_TYPE_YX:
    std::__cxx11::string::operator=(local_70,"yx");
    result_swizzle_string.field_2._12_4_ = 2;
    uStack_48 = 1;
    break;
  case SWIZZLE_TYPE_YXX:
    std::__cxx11::string::operator=(local_70,"yxx");
    result_swizzle_string.field_2._12_4_ = 3;
    uStack_48 = 1;
    result_component_order._0_8_ = result_component_order._0_8_ & 0xffffffff00000000;
    break;
  case SWIZZLE_TYPE_YXXY:
    std::__cxx11::string::operator=(local_70,"yxxy");
    result_swizzle_string.field_2._12_4_ = 4;
    uStack_48 = 1;
    result_component_order[0] = 0;
    result_component_order[1] = 1;
    break;
  case SWIZZLE_TYPE_Z:
    std::__cxx11::string::operator=(local_70,"z");
    result_swizzle_string.field_2._12_4_ = 1;
    uStack_48 = CONCAT44(result_n_components,2);
    break;
  case SWIZZLE_TYPE_ZY:
    std::__cxx11::string::operator=(local_70,"zy");
    result_swizzle_string.field_2._12_4_ = 2;
    uStack_48 = 0x100000002;
    break;
  case SWIZZLE_TYPE_W:
    std::__cxx11::string::operator=(local_70,"w");
    result_swizzle_string.field_2._12_4_ = 1;
    uStack_48 = CONCAT44(result_n_components,3);
    break;
  case SWIZZLE_TYPE_WX:
    std::__cxx11::string::operator=(local_70,"wx");
    result_swizzle_string.field_2._12_4_ = 2;
    uStack_48 = 3;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized swizzle type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1daa);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (out_swizzle_string != (string *)0x0) {
    std::__cxx11::string::operator=((string *)out_swizzle_string,local_70);
  }
  if (out_n_components != (uint *)0x0) {
    *out_n_components = result_swizzle_string.field_2._12_4_;
  }
  if (out_component_order != (uint *)0x0) {
    memcpy(out_component_order,&stack0xffffffffffffffb8,
           (ulong)(uint)result_swizzle_string.field_2._12_4_ << 2);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void GPUShaderFP64Test5::getSwizzleTypeProperties(_swizzle_type type, std::string* out_swizzle_string,
												  unsigned int* out_n_components, unsigned int* out_component_order)
{
	unsigned int result_component_order[4] = { 0 };
	unsigned int result_n_components	   = 0;
	std::string  result_swizzle_string;

	switch (type)
	{
	case SWIZZLE_TYPE_NONE:
	{
		result_swizzle_string = "";
		result_n_components   = 0;

		break;
	}

	case SWIZZLE_TYPE_XWZY:
	{
		result_swizzle_string	 = "xwzy";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 3;
		result_component_order[2] = 2;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZXY:
	{
		result_swizzle_string	 = "xzxy";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 0;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZY:
	{
		result_swizzle_string	 = "xzy";
		result_n_components		  = 3;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 1;

		break;
	}

	case SWIZZLE_TYPE_XZYW:
	{
		result_swizzle_string	 = "xzyw";
		result_n_components		  = 4;
		result_component_order[0] = 0;
		result_component_order[1] = 2;
		result_component_order[2] = 1;
		result_component_order[3] = 3;

		break;
	}

	case SWIZZLE_TYPE_Y:
	{
		result_swizzle_string	 = "y";
		result_n_components		  = 1;
		result_component_order[0] = 1;

		break;
	}

	case SWIZZLE_TYPE_YX:
	{
		result_swizzle_string	 = "yx";
		result_n_components		  = 2;
		result_component_order[0] = 1;
		result_component_order[1] = 0;

		break;
	}

	case SWIZZLE_TYPE_YXX:
	{
		result_swizzle_string	 = "yxx";
		result_n_components		  = 3;
		result_component_order[0] = 1;
		result_component_order[1] = 0;
		result_component_order[2] = 0;

		break;
	}

	case SWIZZLE_TYPE_YXXY:
	{
		result_swizzle_string	 = "yxxy";
		result_n_components		  = 4;
		result_component_order[0] = 1;
		result_component_order[1] = 0;
		result_component_order[2] = 0;
		result_component_order[3] = 1;

		break;
	}

	case SWIZZLE_TYPE_Z:
	{
		result_swizzle_string	 = "z";
		result_n_components		  = 1;
		result_component_order[0] = 2;

		break;
	}

	case SWIZZLE_TYPE_ZY:
	{
		result_swizzle_string	 = "zy";
		result_n_components		  = 2;
		result_component_order[0] = 2;
		result_component_order[1] = 1;

		break;
	}

	case SWIZZLE_TYPE_W:
	{
		result_swizzle_string	 = "w";
		result_n_components		  = 1;
		result_component_order[0] = 3;

		break;
	}

	case SWIZZLE_TYPE_WX:
	{
		result_swizzle_string	 = "wx";
		result_n_components		  = 2;
		result_component_order[0] = 3;
		result_component_order[1] = 0;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized swizzle type");
	}
	} /* switch (type) */

	if (out_swizzle_string != DE_NULL)
	{
		*out_swizzle_string = result_swizzle_string;
	}

	if (out_n_components != DE_NULL)
	{
		*out_n_components = result_n_components;
	}

	if (out_component_order != DE_NULL)
	{
		memcpy(out_component_order, result_component_order, sizeof(unsigned int) * result_n_components);
	}
}